

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::String::Format(char *format,...)

{
  int iVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  char *in_RSI;
  String *in_RDI;
  String SVar3;
  int size;
  int kBufferSize;
  char buffer [4096];
  va_list args;
  String *this;
  char *in_stack_ffffffffffffef18;
  String *in_stack_ffffffffffffef20;
  char local_1028 [4096];
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  String *local_8;
  
  local_18 = &stack0xffffffffffffef18;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  this = in_RDI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = vsnprintf(local_1028,0x1000,in_RSI,&local_28);
  if ((iVar1 < 0) || (0xfff < iVar1)) {
    String(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18);
    sVar2 = extraout_RDX;
  }
  else {
    String(this,(char *)in_RDI,0x1e8877);
    sVar2 = extraout_RDX_00;
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String String::Format(const char * format, ...) {
  va_list args;
  va_start(args, format);

  char buffer[4096];
  const int kBufferSize = sizeof(buffer)/sizeof(buffer[0]);

  // MSVC 8 deprecates vsnprintf(), so we want to suppress warning
  // 4996 (deprecated function) there.
#ifdef _MSC_VER  // We are using MSVC.
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4996)  // Temporarily disables warning 4996.

  const int size = vsnprintf(buffer, kBufferSize, format, args);

# pragma warning(pop)           // Restores the warning state.
#else  // We are not using MSVC.
  const int size = vsnprintf(buffer, kBufferSize, format, args);
#endif  // _MSC_VER
  va_end(args);

  // vsnprintf()'s behavior is not portable.  When the buffer is not
  // big enough, it returns a negative value in MSVC, and returns the
  // needed buffer size on Linux.  When there is an output error, it
  // always returns a negative value.  For simplicity, we lump the two
  // error cases together.
  if (size < 0 || size >= kBufferSize) {
    return String("<formatting error or buffer exceeded>");
  } else {
    return String(buffer, size);
  }
}